

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Engine.cpp
# Opt level: O3

collision_configuration_ptr __thiscall
APhyBullet::BulletEngine::createDefaultCollisionConfiguration(BulletEngine *this)

{
  btDefaultCollisionConfiguration *this_00;
  BulletCollisionConfiguration *this_01;
  collision_configuration_ptr prVar1;
  btDefaultCollisionConstructionInfo local_38;
  
  this_00 = (btDefaultCollisionConfiguration *)operator_new(0xb8);
  local_38.m_persistentManifoldPool = (btPoolAllocator *)0x0;
  local_38.m_collisionAlgorithmPool = (btPoolAllocator *)0x0;
  local_38.m_defaultMaxPersistentManifoldPoolSize = 0x1000;
  local_38.m_defaultMaxCollisionAlgorithmPoolSize = 0x1000;
  local_38.m_customCollisionAlgorithmMaxElementSize = 0;
  local_38.m_useEpaPenetrationAlgorithm = 1;
  btDefaultCollisionConfiguration::btDefaultCollisionConfiguration(this_00,&local_38);
  this_01 = (BulletCollisionConfiguration *)operator_new(0x18);
  BulletCollisionConfiguration::BulletCollisionConfiguration
            (this_01,(btCollisionConfiguration *)this_00);
  prVar1 = (collision_configuration_ptr)operator_new(0x18);
  prVar1->dispatchTable = (aphy_icd_dispatch *)aphy::cppRefcountedDispatchTable;
  prVar1->object = (collision_configuration *)this_01;
  prVar1->strongCount = (__atomic_base<unsigned_int>)0x1;
  prVar1->weakCount = (__atomic_base<unsigned_int>)0x0;
  (this_01->super_collision_configuration).super_base_interface.myRefCounter = prVar1;
  return prVar1;
}

Assistant:

collision_configuration_ptr BulletEngine::createDefaultCollisionConfiguration()
{
    return makeObject<BulletCollisionConfiguration> (new btDefaultCollisionConfiguration ()).disown();
}